

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

_Bool player_has_temporary_slay(player *p,wchar_t idx)

{
  int *piVar1;
  wchar_t i;
  ulong uVar2;
  
  piVar1 = &timed_effects[0].temp_slay;
  for (uVar2 = 0; (uVar2 != 0x35 && ((*piVar1 != idx || (p->timed[uVar2] == 0)))); uVar2 = uVar2 + 1
      ) {
    piVar1 = piVar1 + 0x1e;
  }
  return uVar2 < 0x35;
}

Assistant:

bool player_has_temporary_slay(const struct player *p, int idx)
{
	int i = 0;

	while (i < TMD_MAX) {
		if (timed_effects[i].temp_slay == idx && p->timed[i]) {
			return true;
		}
		++i;
	}
	return false;
}